

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O1

VarValue *
deqp::gles2::Functional::generateRandomVarValue
          (VarValue *__return_storage_ptr__,DataType type,Random *rnd,int samplerUnit)

{
  uint uVar1;
  deUint32 dVar2;
  deBool dVar3;
  ulong uVar4;
  int i;
  long lVar5;
  float fVar6;
  
  uVar1 = glu::getDataTypeScalarSize(type);
  __return_storage_ptr__->type = type;
  if ((type - TYPE_FLOAT < 4) || (type - TYPE_FLOAT_MAT2 < 9 || type - TYPE_DOUBLE_MAT2 < 9)) {
    if (0 < (int)uVar1) {
      uVar4 = 0;
      do {
        fVar6 = deRandom_getFloat(&rnd->m_rnd);
        *(float *)((long)&__return_storage_ptr__->val + uVar4 * 4) = fVar6 * 20.0 + -10.0;
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
  }
  else if (type - TYPE_INT < 4) {
    if (0 < (int)uVar1) {
      uVar4 = 0;
      do {
        dVar2 = deRandom_getUint32(&rnd->m_rnd);
        *(uint *)((long)&__return_storage_ptr__->val + uVar4 * 4) = dVar2 % 0x15 - 10;
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
  }
  else if (type - TYPE_BOOL < 4) {
    if (0 < (int)uVar1) {
      uVar4 = 0;
      do {
        dVar3 = deRandom_getBool(&rnd->m_rnd);
        (__return_storage_ptr__->val).boolV[uVar4] = dVar3 == 1;
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
  }
  else if (type - TYPE_SAMPLER_1D < 0x1e) {
    (__return_storage_ptr__->val).samplerV.unit = samplerUnit;
    lVar5 = 0;
    do {
      fVar6 = deRandom_getFloat(&rnd->m_rnd);
      *(float *)((long)&__return_storage_ptr__->val + lVar5 * 4 + 4) = fVar6 + 0.0;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
  }
  return __return_storage_ptr__;
}

Assistant:

static VarValue generateRandomVarValue (const glu::DataType type, Random& rnd, int samplerUnit = -1 /* Used if type is a sampler type. \note Samplers' unit numbers are not randomized. */)
{
	const int	numElems = glu::getDataTypeScalarSize(type);
	VarValue	result;
	result.type = type;

	DE_ASSERT((samplerUnit >= 0) == (glu::isDataTypeSampler(type)));

	if (glu::isDataTypeFloatOrVec(type) || glu::isDataTypeMatrix(type))
	{
		for (int i = 0; i < numElems; i++)
			result.val.floatV[i] = rnd.getFloat(-10.0f, 10.0f);
	}
	else if (glu::isDataTypeIntOrIVec(type))
	{
		for (int i = 0; i < numElems; i++)
			result.val.intV[i] = rnd.getInt(-10, 10);
	}
	else if (glu::isDataTypeBoolOrBVec(type))
	{
		for (int i = 0; i < numElems; i++)
			result.val.boolV[i] = rnd.getBool();
	}
	else if (glu::isDataTypeSampler(type))
	{
		result.val.samplerV.unit = samplerUnit;

		for (int i = 0; i < 4; i++)
			result.val.samplerV.fillColor[i] = rnd.getFloat(0.0f, 1.0f);
	}
	else
		DE_ASSERT(false);

	return result;
}